

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  bool bVar1;
  ImFont **ppIVar2;
  long in_RDI;
  ImVec4 border_col;
  ImVec4 tint_col;
  ImFont *font;
  int i;
  ImVec4 *in_stack_00000078;
  ImVec4 *in_stack_00000080;
  ImVec2 *in_stack_00000088;
  ImVec2 *in_stack_00000090;
  ImVec2 *in_stack_00000098;
  ImTextureID in_stack_000000a0;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 in_stack_ffffffffffffffc0;
  ImVec4 local_38;
  ImVec4 local_28;
  ImFont *local_18;
  int local_c;
  long local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; local_c < *(int *)(local_8 + 0x48); local_c = local_c + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(local_8 + 0x48),local_c);
    local_18 = *ppIVar2;
    PushID((void *)in_stack_ffffffffffffffc0);
    DebugNodeFont((ImFont *)tint_col._0_8_);
    PopID();
  }
  bVar1 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)*(uint *)(local_8 + 0x30),
                   (ulong)*(uint *)(local_8 + 0x34));
  if (bVar1) {
    ImVec4::ImVec4(&local_28,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&local_38,1.0,1.0,1.0,0.5);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,(float)*(int *)(local_8 + 0x30),
                   (float)*(int *)(local_8 + 0x34));
    ImVec2::ImVec2(&local_48,0.0,0.0);
    ImVec2::ImVec2(&local_50,1.0,1.0);
    Image(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
          in_stack_00000078);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}